

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerMSL::analyze_argument_buffers(CompilerMSL *this)

{
  char cVar1;
  BaseType basetype;
  uint value;
  size_t sVar2;
  Variant *pVVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  undefined2 uVar7;
  Dim DVar8;
  bool bVar9;
  undefined1 uVar10;
  ImageFormat IVar11;
  AccessQualifier AVar12;
  TypeID TVar13;
  TypeID TVar14;
  bool bVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  ID IVar18;
  long lVar19;
  key_type kVar20;
  mapped_type *pmVar21;
  const_iterator cVar22;
  char *pcVar23;
  SPIRType *pSVar24;
  undefined4 extraout_var;
  SPIRType *pSVar25;
  SPIRType *pSVar26;
  SPIRType *pSVar27;
  const_iterator cVar28;
  mapped_type *pmVar29;
  const_iterator cVar30;
  undefined1 *puVar31;
  ulong uVar32;
  uint *ts_1;
  string *psVar33;
  MSLConstexprSampler *pMVar34;
  SmallVector<Resource,_8UL> *pSVar35;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts;
  CompilerMSL *pCVar36;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  uint32_t uVar37;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *pSVar38;
  Resource *__i;
  long lVar39;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *pSVar40;
  byte bVar41;
  bool needs_buffer_sizes;
  uint32_t uint_ptr_type_id;
  uint32_t var_id;
  SmallVector<unsigned_int,_8UL> inline_block_vars;
  uint32_t ptr_type_id;
  SetBindingPair pair;
  bool set_needs_buffer_sizes [8];
  bool set_needs_swizzle_buffer [8];
  SPIRType uint_type_pointer;
  SmallVector<Resource,_8UL> resources_in_set [8];
  char (*in_stack_ffffffffffffee58) [2];
  char local_1199;
  SPIRType *local_1198;
  CompilerMSL *local_1190;
  SPIRType *local_1188;
  uint local_117c;
  MSLConstexprSampler *local_1178;
  string local_1170;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *local_1150;
  SmallVector<Resource,_8UL> *local_1148;
  uint32_t local_1140;
  undefined4 uStack_113c;
  undefined1 local_1130 [16];
  undefined8 local_1120;
  undefined1 local_1118 [56];
  ParsedIR *local_10e0;
  uint32_t local_10d4;
  key_type local_10d0;
  SmallVector<bool,_8UL> *local_10c8;
  _Hashtable<spirv_cross::SetBindingPair,_spirv_cross::SetBindingPair,_std::allocator<spirv_cross::SetBindingPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_10c0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_10b8;
  char local_10b0 [8];
  map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *local_10a8;
  char local_10a0 [8];
  undefined1 local_1098 [8];
  string local_1090;
  undefined8 local_1070;
  uint32_t local_1068;
  TypedID<(spirv_cross::Types)1> local_1060 [8];
  bool *local_1040;
  size_t local_1038;
  bool local_1028 [8];
  uint32_t local_1020;
  bool local_101c;
  StorageClass local_1018;
  TypedID<(spirv_cross::Types)1> *local_1010;
  size_t local_1008;
  TypedID<(spirv_cross::Types)1> local_ff8 [8];
  _Hash_node_base *local_fd8;
  size_t local_fd0;
  _Hash_node_base local_fc0 [7];
  TypeID local_f84;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_f80;
  _Hashtable<spirv_cross::SetBindingPair,_spirv_cross::SetBindingPair,_std::allocator<spirv_cross::SetBindingPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_f48;
  _Base_ptr local_f40;
  string local_f38;
  string local_f18;
  undefined1 local_ef8 [24];
  undefined1 local_ee0 [3760];
  
  bVar41 = 0;
  this->argument_buffer_ids[4] = 0;
  this->argument_buffer_ids[5] = 0;
  this->argument_buffer_ids[6] = 0;
  this->argument_buffer_ids[7] = 0;
  this->argument_buffer_ids[0] = 0;
  this->argument_buffer_ids[1] = 0;
  this->argument_buffer_ids[2] = 0;
  this->argument_buffer_ids[3] = 0;
  lVar19 = 0xec0;
  puVar31 = local_ee0;
  do {
    *(undefined8 *)(puVar31 + -0x10) = 0;
    *(undefined1 **)(puVar31 + -0x18) = puVar31;
    *(undefined8 *)(puVar31 + -8) = 8;
    puVar31 = puVar31 + 0x1d8;
    lVar19 = lVar19 + -0x1d8;
  } while (lVar19 != 0);
  local_1118._0_8_ = local_1118 + 0x18;
  local_1118._8_8_ = 0;
  local_1118._16_8_ = 8;
  local_10a0[0] = '\0';
  local_10a0[1] = '\0';
  local_10a0[2] = '\0';
  local_10a0[3] = '\0';
  local_10a0[4] = '\0';
  local_10a0[5] = '\0';
  local_10a0[6] = '\0';
  local_10a0[7] = '\0';
  local_10b0[0] = '\0';
  local_10b0[1] = '\0';
  local_10b0[2] = '\0';
  local_10b0[3] = '\0';
  local_10b0[4] = '\0';
  local_10b0[5] = '\0';
  local_10b0[6] = '\0';
  local_10b0[7] = '\0';
  local_1199 = '\0';
  local_10e0 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(local_10e0);
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  local_1190 = this;
  if (sVar2 != 0) {
    pSVar40 = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
              (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    pSVar38 = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
              ((pSVar40->stack_storage).aligned_char + sVar2 * 4 + -0x18);
    local_10c8 = (SmallVector<bool,_8UL> *)&this->constexpr_samplers_by_id;
    local_10c0 = &(this->inline_uniform_blocks)._M_h;
    local_10b8 = &(this->buffers_requiring_array_length)._M_h;
    local_1150 = pSVar38;
    do {
      IVar18.id = *(uint32_t *)
                   &(pSVar40->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).ptr;
      pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar3[IVar18.id].type == TypeVariable) {
        kVar20 = (key_type)Variant::get<spirv_cross::SPIRVariable>(pVVar3 + IVar18.id);
        if (((*(StorageClass *)((long)kVar20 + 0x10) < (StorageClassStorageBuffer|StorageClassInput)
             ) && ((0x1005U >> (*(StorageClass *)((long)kVar20 + 0x10) & 0x1f) & 1) != 0)) &&
           (bVar15 = Compiler::is_hidden_variable((Compiler *)this,(SPIRVariable *)kVar20,false),
           !bVar15)) {
          uVar16 = Compiler::get_decoration((Compiler *)this,IVar18,DecorationDescriptorSet);
          local_1198 = (SPIRType *)CONCAT44(local_1198._4_4_,uVar16);
          if (((uVar16 < 8) && ((this->msl_options).argument_buffers != false)) &&
             ((this->argument_buffer_discrete_mask >> (uVar16 & 0x1f) & 1) == 0)) {
            IVar18.id = ((ID *)((long)kVar20 + 8))->id;
            local_1140 = IVar18.id;
            local_1188 = Compiler::get_variable_data_type((Compiler *)this,(SPIRVariable *)kVar20);
            if ((*(int *)&(local_1188->super_IVariant).field_0xc - 0x11U < 2) &&
               (local_1178 = find_constexpr_sampler(this,IVar18.id),
               local_1178 != (MSLConstexprSampler *)0x0)) {
              pmVar21 = ::std::
                        map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
                        ::operator[]((map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
                                      *)local_10c8,&local_1140);
              pMVar34 = local_1178;
              for (lVar19 = 0x19; IVar18.id = local_1140, lVar19 != 0; lVar19 = lVar19 + -1) {
                pmVar21->coord = pMVar34->coord;
                pMVar34 = (MSLConstexprSampler *)((long)pMVar34 + (ulong)bVar41 * -8 + 4);
                pmVar21 = (mapped_type *)((long)pmVar21 + (ulong)bVar41 * -8 + 4);
              }
            }
            else {
              local_1178 = (MSLConstexprSampler *)0x0;
            }
            uVar16 = Compiler::get_decoration((Compiler *)this,IVar18,DecorationBinding);
            if (*(int *)&(local_1188->super_IVariant).field_0xc == 0x11) {
              CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,local_1140);
              uVar16 = 1;
              if (((local_1178 == (MSLConstexprSampler *)0x0) ||
                  (local_1178->ycbcr_conversion_enable != true)) ||
                 (uVar16 = local_1178->planes, uVar16 != 0)) {
                local_1148 = (SmallVector<Resource,_8UL> *)
                             (local_ef8 + (((ulong)local_1198 & 0xffffffff) * 0x3b + -1) * 8 + 8);
                uVar37 = 0;
                do {
                  pCVar36 = local_1190;
                  uVar17 = get_metal_resource_index(local_1190,(SPIRVariable *)kVar20,Image,uVar37);
                  local_1098 = (undefined1  [8])kVar20;
                  (*(pCVar36->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                            (&local_1090,pCVar36,(ulong)local_1140);
                  local_1070 = CONCAT44(uVar17,Image);
                  local_1068 = uVar37;
                  SmallVector<Resource,_8UL>::push_back(local_1148,(Resource *)local_1098);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1090._M_dataplus._M_p != &local_1090.field_2) {
                    operator_delete(local_1090._M_dataplus._M_p);
                  }
                  this = local_1190;
                  uVar37 = uVar37 + 1;
                } while (uVar16 != uVar37);
                if ((local_1178 == (MSLConstexprSampler *)0x0) &&
                   ((local_1188->image).dim != DimBuffer)) {
                  uVar16 = get_metal_resource_index(local_1190,(SPIRVariable *)kVar20,Sampler,0);
                  local_1098 = (undefined1  [8])kVar20;
                  to_sampler_expression_abi_cxx11_(&local_1090,this,local_1140);
                  local_1070 = CONCAT44(uVar16,Sampler);
                  pSVar35 = local_1148;
LAB_00250016:
                  local_1068 = 0;
                  SmallVector<Resource,_8UL>::push_back(pSVar35,(Resource *)local_1098);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1090._M_dataplus._M_p != &local_1090.field_2) {
                    operator_delete(local_1090._M_dataplus._M_p);
                  }
                }
              }
            }
            else {
              local_1098._4_4_ = uVar16;
              local_1098._0_4_ = (uint32_t)local_1198;
              cVar30 = ::std::
                       _Hashtable<spirv_cross::SetBindingPair,_spirv_cross::SetBindingPair,_std::allocator<spirv_cross::SetBindingPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::find(local_10c0,(key_type *)local_1098);
              if (cVar30.super__Node_iterator_base<spirv_cross::SetBindingPair,_true>._M_cur ==
                  (__node_type *)0x0) {
                if ((local_1178 == (MSLConstexprSampler *)0x0) &&
                   ((((this->msl_options).platform != iOS ||
                     (*(int *)&(local_1188->super_IVariant).field_0xc != 0x10)) ||
                    ((local_1188->image).sampled != 2)))) {
                  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,local_1140);
                  local_1098 = (undefined1  [8])kVar20;
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                            (&local_1090,this,(ulong)local_1140);
                  basetype = *(BaseType *)&(local_1188->super_IVariant).field_0xc;
                  local_1070 = CONCAT44(local_1070._4_4_,basetype);
                  uVar16 = get_metal_resource_index(this,(SPIRVariable *)kVar20,basetype,0);
                  pSVar35 = (SmallVector<Resource,_8UL> *)
                            (local_ef8 + (((ulong)local_1198 & 0xffffffff) * 0x3b + -1) * 8 + 8);
                  local_1070 = CONCAT44(uVar16,(BaseType)local_1070);
                  goto LAB_00250016;
                }
              }
              else {
                SmallVector<unsigned_int,_8UL>::reserve
                          ((SmallVector<unsigned_int,_8UL> *)local_1118,local_1118._8_8_ + 1);
                *(uint32_t *)
                 ((long)(&((SmallVector<unsigned_int,_8UL> *)(local_1118._0_8_ + 0x20))->
                          stack_storage + -2) + 8 + local_1118._8_8_ * 4) = local_1140;
                local_1118._8_8_ = local_1118._8_8_ + 1;
              }
            }
            pSVar38 = local_1150;
            if ((this->needs_swizzle_buffer_def == true) &&
               (bVar15 = Compiler::is_sampled_image_type((Compiler *)this,local_1188), bVar15)) {
              pcVar23 = local_10a0 + ((ulong)local_1198 & 0xffffffff);
            }
            else {
              cVar22 = ::std::
                       _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::find(local_10b8,&local_1140);
              if (cVar22.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0
                 ) goto LAB_00250139;
              local_10b0[(ulong)local_1198 & 0xffffffff] = '\x01';
              pcVar23 = &local_1199;
            }
            *pcVar23 = '\x01';
          }
        }
      }
LAB_00250139:
      pSVar40 = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                ((long)&(pSVar40->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).
                        ptr + 4);
    } while (pSVar40 != pSVar38);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_1170);
  if ((this->needs_swizzle_buffer_def != false) || (local_1199 == '\x01')) {
    local_1170._M_dataplus._M_p._0_4_ = 0;
    pSVar35 = (SmallVector<Resource,_8UL> *)local_ef8;
    lVar19 = 0;
    do {
      cVar1 = local_10a0[lVar19];
      if ((cVar1 != '\0') || (local_10b0[lVar19] == '\x01')) {
        if (local_1170._M_dataplus._M_p._0_4_ == 0) {
          local_1170._M_dataplus._M_p._0_4_ = ParsedIR::increase_bound_by(local_10e0,1);
          uVar16 = get_uint_type_id(local_1190);
          pSVar24 = Variant::get<spirv_cross::SPIRType>
                              ((local_1190->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + uVar16);
          SPIRType::SPIRType((SPIRType *)local_1098,pSVar24);
          pCVar36 = local_1190;
          local_101c = true;
          local_1020 = 1;
          local_f84.id = get_uint_type_id(local_1190);
          local_1018 = StorageClassUniform;
          Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                    ((Compiler *)pCVar36,local_1170._M_dataplus._M_p._0_4_,(SPIRType *)local_1098);
          Compiler::set_decoration
                    ((Compiler *)pCVar36,local_1170._M_dataplus._M_p._0_4_,DecorationArrayStride,4);
          local_1098 = (undefined1  [8])&PTR__SPIRType_003574a8;
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&local_f80);
          local_fd0 = 0;
          if (local_fd8 != local_fc0) {
            free(local_fd8);
          }
          local_1008 = 0;
          if (local_1010 != local_ff8) {
            free(local_1010);
          }
          local_1038 = 0;
          if (local_1040 != local_1028) {
            free(local_1040);
          }
          local_1070 = 0;
          if ((TypedID<(spirv_cross::Types)1> *)local_1090.field_2._8_8_ != local_1060) {
            free((void *)local_1090.field_2._8_8_);
          }
        }
        if (cVar1 != '\0') {
          IVar18.id = ParsedIR::increase_bound_by(local_10e0,1);
          local_1098 = (undefined1  [8])((ulong)local_1098 & 0xffffffff00000000);
          kVar20 = (key_type)
                   Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                             ((Compiler *)local_1190,IVar18.id,(uint *)&local_1170,
                              (StorageClass *)local_1098);
          local_1098 = (undefined1  [8])&local_1090._M_string_length;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1098,"spvSwizzleConstants","");
          Compiler::set_name((Compiler *)local_1190,IVar18,(string *)local_1098);
          if (local_1098 != (undefined1  [8])&local_1090._M_string_length) {
            operator_delete((void *)local_1098);
          }
          pCVar36 = local_1190;
          Compiler::set_decoration
                    ((Compiler *)local_1190,IVar18,DecorationDescriptorSet,(uint32_t)lVar19);
          Compiler::set_decoration((Compiler *)pCVar36,IVar18,DecorationBinding,0xfffffffe);
          local_1098 = (undefined1  [8])kVar20;
          (*(pCVar36->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&local_1090,pCVar36,(ulong)IVar18.id);
          local_1070 = CONCAT44(local_1070._4_4_,UInt);
          uVar16 = get_metal_resource_index(pCVar36,(SPIRVariable *)kVar20,UInt,0);
          local_1070 = CONCAT44(uVar16,(BaseType)local_1070);
          local_1068 = 0;
          SmallVector<Resource,_8UL>::push_back(pSVar35,(Resource *)local_1098);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1090._M_dataplus._M_p != &local_1090.field_2) {
            operator_delete(local_1090._M_dataplus._M_p);
          }
        }
        if (local_10b0[lVar19] == '\x01') {
          IVar18.id = ParsedIR::increase_bound_by(local_10e0,1);
          local_1098 = (undefined1  [8])((ulong)local_1098 & 0xffffffff00000000);
          kVar20 = (key_type)
                   Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                             ((Compiler *)local_1190,IVar18.id,(uint *)&local_1170,
                              (StorageClass *)local_1098);
          local_1098 = (undefined1  [8])&local_1090._M_string_length;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1098,"spvBufferSizeConstants","");
          Compiler::set_name((Compiler *)local_1190,IVar18,(string *)local_1098);
          if (local_1098 != (undefined1  [8])&local_1090._M_string_length) {
            operator_delete((void *)local_1098);
          }
          pCVar36 = local_1190;
          Compiler::set_decoration
                    ((Compiler *)local_1190,IVar18,DecorationDescriptorSet,(uint32_t)lVar19);
          Compiler::set_decoration((Compiler *)pCVar36,IVar18,DecorationBinding,0xfffffffd);
          local_1098 = (undefined1  [8])kVar20;
          (*(pCVar36->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&local_1090,pCVar36,(ulong)IVar18.id);
          local_1070 = CONCAT44(local_1070._4_4_,UInt);
          uVar16 = get_metal_resource_index(pCVar36,(SPIRVariable *)kVar20,UInt,0);
          local_1070 = CONCAT44(uVar16,(BaseType)local_1070);
          local_1068 = 0;
          SmallVector<Resource,_8UL>::push_back(pSVar35,(Resource *)local_1098);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1090._M_dataplus._M_p != &local_1090.field_2) {
            operator_delete(local_1090._M_dataplus._M_p);
          }
        }
      }
      lVar19 = lVar19 + 1;
      pSVar35 = pSVar35 + 1;
      this = local_1190;
    } while (lVar19 != 8);
  }
  if (local_1118._8_8_ != 0) {
    local_1198 = (SPIRType *)local_1118._0_8_;
    lVar19 = local_1118._8_8_ << 2;
    lVar39 = 0;
    do {
      IVar18.id = *(uint32_t *)((long)(&(local_1198->array).stack_storage + -2) + 8 + lVar39);
      kVar20 = (key_type)
               Variant::get<spirv_cross::SPIRVariable>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + IVar18.id);
      uVar16 = Compiler::get_decoration((Compiler *)this,IVar18,DecorationDescriptorSet);
      CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,IVar18.id);
      local_1098 = (undefined1  [8])kVar20;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (&local_1090,this,(ulong)IVar18.id);
      local_1070 = CONCAT44(local_1070._4_4_,Struct);
      uVar37 = get_metal_resource_index(this,(SPIRVariable *)kVar20,Struct,0);
      local_1070 = CONCAT44(uVar37,(BaseType)local_1070);
      local_1068 = 0;
      SmallVector<Resource,_8UL>::push_back
                ((SmallVector<Resource,_8UL> *)(local_ef8 + ((ulong)uVar16 * 0x3b + -1) * 8 + 8),
                 (Resource *)local_1098);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1090._M_dataplus._M_p != &local_1090.field_2) {
        operator_delete(local_1090._M_dataplus._M_p);
      }
      lVar39 = lVar39 + 4;
      this = local_1190;
    } while (lVar19 != lVar39);
  }
  local_117c = 0;
  local_10b8 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&this->plane_name_suffix;
  local_10a8 = &this->buffers_requiring_dynamic_offset;
  local_f40 = &(this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header._M_header
  ;
  local_f48 = &(this->inline_uniform_blocks)._M_h;
  do {
    uVar32 = (ulong)local_117c;
    if (*(long *)(local_ef8 + uVar32 * 0x1d8 + 8) != 0) {
      if (((this->msl_options).argument_buffers != true) ||
         ((this->argument_buffer_discrete_mask >> (local_117c & 0x1f) & 1) != 0)) {
        __assert_fail("descriptor_set_is_argument_buffer(desc_set)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x350d,"void spirv_cross::CompilerMSL::analyze_argument_buffers()");
      }
      uVar16 = ParsedIR::increase_bound_by(local_10e0,3);
      local_1120 = CONCAT44(extraout_var,uVar16);
      IVar18.id = uVar16 + 1;
      local_10d4 = uVar16 + 2;
      this->argument_buffer_ids[local_117c] = uVar16;
      local_1198 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,IVar18.id);
      *(undefined4 *)&(local_1198->super_IVariant).field_0xc = 0xf;
      ts_1 = (uint *)(ulong)local_117c;
      if ((this->argument_buffer_device_storage_mask >> (local_117c & 0x1f) & 1) == 0) {
        local_1198->storage = StorageClassUniform;
      }
      else {
        local_1198->storage = StorageClassStorageBuffer;
        Compiler::set_decoration((Compiler *)this,(ID)(uint32_t)local_1120,DecorationNonWritable,0);
        ts_1 = (uint *)0x0;
        Compiler::set_decoration((Compiler *)this,IVar18,DecorationBlock,0);
      }
      join<char_const(&)[23],unsigned_int&>
                ((string *)local_1098,(spirv_cross *)"spvDescriptorSetBuffer",
                 (char (*) [23])&local_117c,ts_1);
      Compiler::set_name((Compiler *)this,IVar18,(string *)local_1098);
      if (local_1098 != (undefined1  [8])&local_1090._M_string_length) {
        operator_delete((void *)local_1098);
      }
      pSVar25 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,local_10d4);
      pSVar24 = local_1198;
      (pSVar25->super_IVariant).self.id = (local_1198->super_IVariant).self.id;
      uVar16 = local_1198->vecsize;
      uVar37 = local_1198->columns;
      *(undefined8 *)&(pSVar25->super_IVariant).field_0xc =
           *(undefined8 *)&(local_1198->super_IVariant).field_0xc;
      pSVar25->vecsize = uVar16;
      pSVar25->columns = uVar37;
      SmallVector<unsigned_int,_8UL>::operator=(&pSVar25->array,&local_1198->array);
      SmallVector<bool,_8UL>::operator=(&pSVar25->array_size_literal,&pSVar24->array_size_literal);
      bVar15 = pSVar24->pointer;
      bVar6 = pSVar24->forward_pointer;
      uVar7 = *(undefined2 *)&pSVar24->field_0x7e;
      pSVar25->pointer_depth = pSVar24->pointer_depth;
      pSVar25->pointer = bVar15;
      pSVar25->forward_pointer = bVar6;
      *(undefined2 *)&pSVar25->field_0x7e = uVar7;
      pSVar25->storage = pSVar24->storage;
      local_1150 = &pSVar24->member_types;
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                (&pSVar25->member_types,local_1150);
      SmallVector<unsigned_int,_8UL>::operator=
                (&pSVar25->member_type_index_redirection,&pSVar24->member_type_index_redirection);
      DVar8 = (pSVar24->image).dim;
      bVar15 = (pSVar24->image).depth;
      bVar6 = (pSVar24->image).arrayed;
      bVar9 = (pSVar24->image).ms;
      uVar10 = (pSVar24->image).field_0xb;
      uVar16 = (pSVar24->image).sampled;
      IVar11 = (pSVar24->image).format;
      AVar12 = (pSVar24->image).access;
      TVar13.id = (pSVar24->type_alias).id;
      TVar14.id = (pSVar24->parent_type).id;
      (pSVar25->image).type = (TypeID)(pSVar24->image).type.id;
      (pSVar25->image).dim = DVar8;
      (pSVar25->image).depth = bVar15;
      (pSVar25->image).arrayed = bVar6;
      (pSVar25->image).ms = bVar9;
      (pSVar25->image).field_0xb = uVar10;
      (pSVar25->image).sampled = uVar16;
      (pSVar25->image).format = IVar11;
      (pSVar25->image).access = AVar12;
      pSVar25->type_alias = (TypeID)TVar13.id;
      pSVar25->parent_type = (TypeID)TVar14.id;
      if (pSVar24 != pSVar25) {
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&pSVar25->member_name_cache,&(local_1198->member_name_cache)._M_h);
      }
      pSVar25->pointer = true;
      pSVar25->pointer_depth = 1;
      (pSVar25->parent_type).id = IVar18.id;
      local_1098._0_4_ = 2;
      IVar18.id = (uint32_t)local_1120;
      psVar33 = (string *)local_1098;
      Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                ((Compiler *)this,IVar18.id,&local_10d4,(StorageClass *)local_1098);
      join<char_const(&)[17],unsigned_int&>
                ((string *)local_1098,(spirv_cross *)"spvDescriptorSet",(char (*) [17])&local_117c,
                 (uint *)psVar33);
      Compiler::set_name((Compiler *)this,IVar18,(string *)local_1098);
      if (local_1098 != (undefined1  [8])&local_1090._M_string_length) {
        operator_delete((void *)local_1098);
      }
      uVar4 = *(ulong *)(local_ef8 + uVar32 * 0x1d8 + 8);
      if (uVar4 != 0) {
        lVar39 = *(long *)(local_ef8 + (uVar32 * 0x3b + -1) * 8 + 8);
        lVar19 = lVar39 + uVar4 * 0x38;
        lVar5 = 0x3f;
        if (uVar4 != 0) {
          for (; uVar4 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        ::std::
        __introsort_loop<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource*,long,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::analyze_argument_buffers()::__1>>
                  (lVar39,lVar19,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)uVar4 < 0x11) {
          ::std::
          __insertion_sort<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::analyze_argument_buffers()::__1>>
                    (lVar39,lVar19);
        }
        else {
          lVar19 = lVar39 + 0x380;
          ::std::
          __insertion_sort<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::analyze_argument_buffers()::__1>>
                    (lVar39,lVar19);
          lVar39 = uVar4 * 0x38 + -0x380;
          do {
            ::std::
            __unguarded_linear_insert<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource*,__gnu_cxx::__ops::_Val_comp_iter<spirv_cross::CompilerMSL::analyze_argument_buffers()::__1>>
                      (lVar19);
            lVar19 = lVar19 + 0x38;
            lVar39 = lVar39 + -0x38;
          } while (lVar39 != 0);
        }
        this = local_1190;
        if (*(long *)(local_ef8 + uVar32 * 0x1d8 + 8) != 0) {
          ts = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (*(long *)(local_ef8 + (uVar32 * 0x3b + -1) * 8 + 8) + 0x30);
          pMVar34 = (MSLConstexprSampler *)(*(long *)(local_ef8 + uVar32 * 0x1d8 + 8) * 0x38);
          local_1148 = (SmallVector<Resource,_8UL> *)((ulong)local_1148 & 0xffffffff00000000);
          do {
            local_1188 = (SPIRType *)ts[-2].field_2._M_allocated_capacity;
            local_1178 = pMVar34;
            pSVar24 = Compiler::get_variable_data_type((Compiler *)this,(SPIRVariable *)local_1188);
            lVar19 = *(long *)((long)&ts[-2].field_2 + 8);
            local_f38._M_dataplus._M_p = (pointer)&local_f38.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f38,lVar19,ts[-1]._M_dataplus._M_p + lVar19);
            local_f18._M_dataplus._M_p = (pointer)&local_f18.field_2;
            psVar33 = &local_f18;
            pCVar36 = (CompilerMSL *)0x2f163e;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)psVar33,"m","");
            ensure_valid_name((string *)local_1098,pCVar36,&local_f38,psVar33);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f18._M_dataplus._M_p != &local_f18.field_2) {
              operator_delete(local_f18._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f38._M_dataplus._M_p != &local_f38.field_2) {
              operator_delete(local_f38._M_dataplus._M_p);
            }
            if (*(int *)&(ts->_M_dataplus)._M_p != 0) {
              join<std::__cxx11::string&,unsigned_int&>
                        (&local_1170,(spirv_cross *)local_10b8,ts,(uint *)psVar33);
              ::std::__cxx11::string::_M_append
                        (local_1098,
                         CONCAT44(local_1170._M_dataplus._M_p._4_4_,
                                  local_1170._M_dataplus._M_p._0_4_));
              if ((void *)CONCAT44(local_1170._M_dataplus._M_p._4_4_,
                                   local_1170._M_dataplus._M_p._0_4_) !=
                  (void *)((long)&local_1170 + 0x10U)) {
                operator_delete((void *)CONCAT44(local_1170._M_dataplus._M_p._4_4_,
                                                 local_1170._M_dataplus._M_p._0_4_));
              }
            }
            Compiler::set_member_name
                      ((Compiler *)this,(TypeID)(local_1198->super_IVariant).self.id,
                       (uint32_t)local_1148,(string *)local_1098);
            if ((*(int *)((long)&ts[-1].field_2 + 8) == 0x12) &&
               (*(int *)&(pSVar24->super_IVariant).field_0xc != 0x12)) {
              sVar2 = (pSVar24->array).super_VectorView<unsigned_int>.buffer_size;
              uVar16 = ParsedIR::increase_bound_by(local_10e0,2 - (sVar2 == 0));
              pSVar26 = Compiler::set<spirv_cross::SPIRType>((Compiler *)local_1190,uVar16);
              pSVar25 = local_1198;
              *(undefined4 *)&(pSVar26->super_IVariant).field_0xc = 0x12;
              pSVar26->storage = StorageClassUniformConstant;
              if (sVar2 == 0) {
                SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                          (local_1150,
                           (local_1198->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                           buffer_size + 1);
                sVar2 = (pSVar25->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
                (pSVar25->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar2].id =
                     uVar16;
                (pSVar25->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size =
                     sVar2 + 1;
                this = local_1190;
              }
              else {
                pSVar27 = Compiler::set<spirv_cross::SPIRType>((Compiler *)local_1190,uVar16 + 1);
                (pSVar27->super_IVariant).self.id = (pSVar26->super_IVariant).self.id;
                uVar37 = pSVar26->vecsize;
                uVar17 = pSVar26->columns;
                *(undefined8 *)&(pSVar27->super_IVariant).field_0xc =
                     *(undefined8 *)&(pSVar26->super_IVariant).field_0xc;
                pSVar27->vecsize = uVar37;
                pSVar27->columns = uVar17;
                local_10c0 = (_Hashtable<spirv_cross::SetBindingPair,_spirv_cross::SetBindingPair,_std::allocator<spirv_cross::SetBindingPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                              *)&pSVar27->array;
                SmallVector<unsigned_int,_8UL>::operator=
                          ((SmallVector<unsigned_int,_8UL> *)local_10c0,&pSVar26->array);
                local_10c8 = &pSVar27->array_size_literal;
                SmallVector<bool,_8UL>::operator=(local_10c8,&pSVar26->array_size_literal);
                bVar15 = pSVar26->pointer;
                bVar6 = pSVar26->forward_pointer;
                uVar7 = *(undefined2 *)&pSVar26->field_0x7e;
                pSVar27->pointer_depth = pSVar26->pointer_depth;
                pSVar27->pointer = bVar15;
                pSVar27->forward_pointer = bVar6;
                *(undefined2 *)&pSVar27->field_0x7e = uVar7;
                pSVar27->storage = pSVar26->storage;
                SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                          (&pSVar27->member_types,&pSVar26->member_types);
                SmallVector<unsigned_int,_8UL>::operator=
                          (&pSVar27->member_type_index_redirection,
                           &pSVar26->member_type_index_redirection);
                DVar8 = (pSVar26->image).dim;
                bVar15 = (pSVar26->image).depth;
                bVar6 = (pSVar26->image).arrayed;
                bVar9 = (pSVar26->image).ms;
                uVar10 = (pSVar26->image).field_0xb;
                uVar37 = (pSVar26->image).sampled;
                IVar11 = (pSVar26->image).format;
                AVar12 = (pSVar26->image).access;
                TVar13.id = (pSVar26->type_alias).id;
                TVar14.id = (pSVar26->parent_type).id;
                (pSVar27->image).type = (TypeID)(pSVar26->image).type.id;
                (pSVar27->image).dim = DVar8;
                (pSVar27->image).depth = bVar15;
                (pSVar27->image).arrayed = bVar6;
                (pSVar27->image).ms = bVar9;
                (pSVar27->image).field_0xb = uVar10;
                (pSVar27->image).sampled = uVar37;
                (pSVar27->image).format = IVar11;
                (pSVar27->image).access = AVar12;
                pSVar27->type_alias = (TypeID)TVar13.id;
                pSVar27->parent_type = (TypeID)TVar14.id;
                if (pSVar26 != pSVar27) {
                  ::std::
                  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  ::
                  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              *)&pSVar27->member_name_cache,&(pSVar26->member_name_cache)._M_h);
                }
                SmallVector<unsigned_int,_8UL>::operator=
                          ((SmallVector<unsigned_int,_8UL> *)local_10c0,&pSVar24->array);
                SmallVector<bool,_8UL>::operator=(local_10c8,&pSVar24->array_size_literal);
                pSVar25 = local_1198;
                (pSVar27->parent_type).id = uVar16;
                SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                          (local_1150,
                           (local_1198->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                           buffer_size + 1);
                sVar2 = (pSVar25->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
                (pSVar25->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar2].id =
                     uVar16 + 1;
                (pSVar25->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size =
                     sVar2 + 1;
                this = local_1190;
              }
            }
            else {
              local_10d0.binding =
                   Compiler::get_decoration
                             ((Compiler *)this,(ID)(local_1188->super_IVariant).self.id,
                              DecorationBinding);
              local_10d0.desc_set = local_117c;
              if (*(int *)((long)&ts[-1].field_2 + 8) - 0x10U < 3) {
                uVar16 = Compiler::get_variable_data_type_id
                                   ((Compiler *)this,(SPIRVariable *)local_1188);
                pSVar24 = local_1198;
                SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                          (local_1150,
                           (local_1198->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                           buffer_size + 1);
                sVar2 = (pSVar24->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
                (pSVar24->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar2].id =
                     uVar16;
                (pSVar24->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size =
                     sVar2 + 1;
                pSVar25 = local_1198;
                if (*(int *)&(ts->_M_dataplus)._M_p == 0) {
                  uVar16 = (local_1188->super_IVariant).self.id;
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                            ((spirv_cross *)&local_1140,this,local_1120,1);
                  join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                            (&local_1170,(spirv_cross *)&local_1140,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x2dfc12,(char (*) [2])local_1098,in_R8);
                  Compiler::set_qualified_name((Compiler *)this,uVar16,&local_1170);
LAB_00251011:
                  if ((void *)CONCAT44(local_1170._M_dataplus._M_p._4_4_,
                                       local_1170._M_dataplus._M_p._0_4_) !=
                      (void *)((long)&local_1170 + 0x10U)) {
                    operator_delete((void *)CONCAT44(local_1170._M_dataplus._M_p._4_4_,
                                                     local_1170._M_dataplus._M_p._0_4_));
                  }
                  pSVar25 = local_1198;
                  if ((undefined1 *)CONCAT44(uStack_113c,local_1140) != local_1130) {
                    operator_delete((undefined1 *)CONCAT44(uStack_113c,local_1140));
                    pSVar25 = local_1198;
                  }
                }
              }
              else {
                cVar28 = ::std::
                         _Rb_tree<spirv_cross::SetBindingPair,_std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                         ::find(&local_10a8->_M_t,&local_10d0);
                pSVar25 = local_1198;
                if (cVar28._M_node == local_f40) {
                  cVar30 = ::std::
                           _Hashtable<spirv_cross::SetBindingPair,_spirv_cross::SetBindingPair,_std::allocator<spirv_cross::SetBindingPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           ::find(local_f48,&local_10d0);
                  pSVar26 = local_1188;
                  pSVar25 = local_1198;
                  if (cVar30.super__Node_iterator_base<spirv_cross::SetBindingPair,_true>._M_cur ==
                      (__node_type *)0x0) {
                    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                              (local_1150,
                               (local_1198->member_types).
                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                               buffer_size + 1);
                    sVar2 = (pSVar25->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                            buffer_size;
                    (pSVar25->member_types).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar2].id =
                         *(uint32_t *)&(local_1188->super_IVariant).field_0xc;
                    (pSVar25->member_types).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size =
                         sVar2 + 1;
                    uVar16 = (local_1188->super_IVariant).self.id;
                    if ((pSVar24->array).super_VectorView<unsigned_int>.buffer_size == 0) {
                      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                                ((char (*) [3])&local_1140,this,local_1120,1);
                      join<char_const(&)[3],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                                (&local_1170,(spirv_cross *)"(*",(char (*) [3])&local_1140,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x2dfc12,(char (*) [2])local_1098,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x2dfe76,in_stack_ffffffffffffee58);
                      Compiler::set_qualified_name((Compiler *)this,uVar16,&local_1170);
                    }
                    else {
                      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                                ((spirv_cross *)&local_1140,this,local_1120,1);
                      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                                (&local_1170,(spirv_cross *)&local_1140,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x2dfc12,(char (*) [2])local_1098,in_R8);
                      Compiler::set_qualified_name((Compiler *)this,uVar16,&local_1170);
                    }
                  }
                  else {
                    uVar16 = Compiler::get_variable_data_type_id
                                       ((Compiler *)this,(SPIRVariable *)local_1188);
                    pSVar24 = local_1198;
                    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                              (local_1150,
                               (local_1198->member_types).
                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                               buffer_size + 1);
                    sVar2 = (pSVar24->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                            buffer_size;
                    (pSVar24->member_types).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar2].id =
                         uVar16;
                    (pSVar24->member_types).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size =
                         sVar2 + 1;
                    uVar16 = (pSVar26->super_IVariant).self.id;
                    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                              ((spirv_cross *)&local_1140,this,local_1120,1);
                    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                              (&local_1170,(spirv_cross *)&local_1140,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x2dfc12,(char (*) [2])local_1098,in_R8);
                    Compiler::set_qualified_name((Compiler *)this,uVar16,&local_1170);
                  }
                  goto LAB_00251011;
                }
                SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                          (local_1150,
                           (local_1198->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                           buffer_size + 1);
                sVar2 = (pSVar25->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
                (pSVar25->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar2].id =
                     *(uint32_t *)&(local_1188->super_IVariant).field_0xc;
                (pSVar25->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size =
                     sVar2 + 1;
                uVar16 = (local_1188->super_IVariant).self.id;
                pmVar29 = ::std::
                          map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                          ::operator[](local_10a8,&local_10d0);
                pmVar29->second = uVar16;
                pSVar25 = local_1198;
              }
            }
            Compiler::set_extended_member_decoration
                      ((Compiler *)this,(pSVar25->super_IVariant).self.id,(uint32_t)local_1148,
                       SPIRVCrossDecorationResourceIndexPrimary,
                       *(uint32_t *)((long)&ts[-1].field_2 + 0xc));
            value = (local_1188->super_IVariant).self.id;
            in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (ulong)value;
            Compiler::set_extended_member_decoration
                      ((Compiler *)this,(local_1198->super_IVariant).self.id,(uint32_t)local_1148,
                       SPIRVCrossDecorationInterfaceOrigID,value);
            pMVar34 = local_1178;
            if (local_1098 != (undefined1  [8])&local_1090._M_string_length) {
              operator_delete((void *)local_1098);
            }
            ts = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&ts[1].field_2 + 8);
            local_1148 = (SmallVector<Resource,_8UL> *)
                         CONCAT44(local_1148._4_4_,(uint32_t)local_1148 + 1);
            pMVar34 = (MSLConstexprSampler *)&pMVar34[-1].max_anisotropy;
          } while (pMVar34 != (MSLConstexprSampler *)0x0);
        }
      }
    }
    local_117c = local_117c + 1;
    if (7 < local_117c) {
      local_1118._8_8_ = 0;
      if ((SPIRType *)local_1118._0_8_ != (SPIRType *)(local_1118 + 0x18)) {
        free((void *)local_1118._0_8_);
      }
      lVar19 = 0xce8;
      do {
        SmallVector<Resource,_8UL>::~SmallVector((SmallVector<Resource,_8UL> *)(local_ef8 + lVar19))
        ;
        lVar19 = lVar19 + -0x1d8;
      } while (lVar19 != -0x1d8);
      return;
    }
  } while( true );
}

Assistant:

void CompilerMSL::analyze_argument_buffers()
{
	// Gather all used resources and sort them out into argument buffers.
	// Each argument buffer corresponds to a descriptor set in SPIR-V.
	// The [[id(N)]] values used correspond to the resource mapping we have for MSL.
	// Otherwise, the binding number is used, but this is generally not safe some types like
	// combined image samplers and arrays of resources. Metal needs different indices here,
	// while SPIR-V can have one descriptor set binding. To use argument buffers in practice,
	// you will need to use the remapping from the API.
	for (auto &id : argument_buffer_ids)
		id = 0;

	// Output resources, sorted by resource index & type.
	struct Resource
	{
		SPIRVariable *var;
		string name;
		SPIRType::BaseType basetype;
		uint32_t index;
		uint32_t plane;
	};
	SmallVector<Resource> resources_in_set[kMaxArgumentBuffers];
	SmallVector<uint32_t> inline_block_vars;

	bool set_needs_swizzle_buffer[kMaxArgumentBuffers] = {};
	bool set_needs_buffer_sizes[kMaxArgumentBuffers] = {};
	bool needs_buffer_sizes = false;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t self, SPIRVariable &var) {
		if ((var.storage == StorageClassUniform || var.storage == StorageClassUniformConstant ||
		     var.storage == StorageClassStorageBuffer) &&
		    !is_hidden_variable(var))
		{
			uint32_t desc_set = get_decoration(self, DecorationDescriptorSet);
			// Ignore if it's part of a push descriptor set.
			if (!descriptor_set_is_argument_buffer(desc_set))
				return;

			uint32_t var_id = var.self;
			auto &type = get_variable_data_type(var);

			if (desc_set >= kMaxArgumentBuffers)
				SPIRV_CROSS_THROW("Descriptor set index is out of range.");

			const MSLConstexprSampler *constexpr_sampler = nullptr;
			if (type.basetype == SPIRType::SampledImage || type.basetype == SPIRType::Sampler)
			{
				constexpr_sampler = find_constexpr_sampler(var_id);
				if (constexpr_sampler)
				{
					// Mark this ID as a constexpr sampler for later in case it came from set/bindings.
					constexpr_samplers_by_id[var_id] = *constexpr_sampler;
				}
			}

			uint32_t binding = get_decoration(var_id, DecorationBinding);
			if (type.basetype == SPIRType::SampledImage)
			{
				add_resource_name(var_id);

				uint32_t plane_count = 1;
				if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
					plane_count = constexpr_sampler->planes;

				for (uint32_t i = 0; i < plane_count; i++)
				{
					uint32_t image_resource_index = get_metal_resource_index(var, SPIRType::Image, i);
					resources_in_set[desc_set].push_back(
					    { &var, to_name(var_id), SPIRType::Image, image_resource_index, i });
				}

				if (type.image.dim != DimBuffer && !constexpr_sampler)
				{
					uint32_t sampler_resource_index = get_metal_resource_index(var, SPIRType::Sampler);
					resources_in_set[desc_set].push_back(
					    { &var, to_sampler_expression(var_id), SPIRType::Sampler, sampler_resource_index, 0 });
				}
			}
			else if (inline_uniform_blocks.count(SetBindingPair{ desc_set, binding }))
			{
				inline_block_vars.push_back(var_id);
			}
			else if (!constexpr_sampler)
			{
				// constexpr samplers are not declared as resources.
				// Inline uniform blocks are always emitted at the end.
				if (!msl_options.is_ios() || type.basetype != SPIRType::Image || type.image.sampled != 2)
				{
					add_resource_name(var_id);
					resources_in_set[desc_set].push_back(
					    { &var, to_name(var_id), type.basetype, get_metal_resource_index(var, type.basetype), 0 });
				}
			}

			// Check if this descriptor set needs a swizzle buffer.
			if (needs_swizzle_buffer_def && is_sampled_image_type(type))
				set_needs_swizzle_buffer[desc_set] = true;
			else if (buffers_requiring_array_length.count(var_id) != 0)
			{
				set_needs_buffer_sizes[desc_set] = true;
				needs_buffer_sizes = true;
			}
		}
	});

	if (needs_swizzle_buffer_def || needs_buffer_sizes)
	{
		uint32_t uint_ptr_type_id = 0;

		// We might have to add a swizzle buffer resource to the set.
		for (uint32_t desc_set = 0; desc_set < kMaxArgumentBuffers; desc_set++)
		{
			if (!set_needs_swizzle_buffer[desc_set] && !set_needs_buffer_sizes[desc_set])
				continue;

			if (uint_ptr_type_id == 0)
			{
				uint_ptr_type_id = ir.increase_bound_by(1);

				// Create a buffer to hold extra data, including the swizzle constants.
				SPIRType uint_type_pointer = get_uint_type();
				uint_type_pointer.pointer = true;
				uint_type_pointer.pointer_depth = 1;
				uint_type_pointer.parent_type = get_uint_type_id();
				uint_type_pointer.storage = StorageClassUniform;
				set<SPIRType>(uint_ptr_type_id, uint_type_pointer);
				set_decoration(uint_ptr_type_id, DecorationArrayStride, 4);
			}

			if (set_needs_swizzle_buffer[desc_set])
			{
				uint32_t var_id = ir.increase_bound_by(1);
				auto &var = set<SPIRVariable>(var_id, uint_ptr_type_id, StorageClassUniformConstant);
				set_name(var_id, "spvSwizzleConstants");
				set_decoration(var_id, DecorationDescriptorSet, desc_set);
				set_decoration(var_id, DecorationBinding, kSwizzleBufferBinding);
				resources_in_set[desc_set].push_back(
				    { &var, to_name(var_id), SPIRType::UInt, get_metal_resource_index(var, SPIRType::UInt), 0 });
			}

			if (set_needs_buffer_sizes[desc_set])
			{
				uint32_t var_id = ir.increase_bound_by(1);
				auto &var = set<SPIRVariable>(var_id, uint_ptr_type_id, StorageClassUniformConstant);
				set_name(var_id, "spvBufferSizeConstants");
				set_decoration(var_id, DecorationDescriptorSet, desc_set);
				set_decoration(var_id, DecorationBinding, kBufferSizeBufferBinding);
				resources_in_set[desc_set].push_back(
				    { &var, to_name(var_id), SPIRType::UInt, get_metal_resource_index(var, SPIRType::UInt), 0 });
			}
		}
	}

	// Now add inline uniform blocks.
	for (uint32_t var_id : inline_block_vars)
	{
		auto &var = get<SPIRVariable>(var_id);
		uint32_t desc_set = get_decoration(var_id, DecorationDescriptorSet);
		add_resource_name(var_id);
		resources_in_set[desc_set].push_back(
		    { &var, to_name(var_id), SPIRType::Struct, get_metal_resource_index(var, SPIRType::Struct), 0 });
	}

	for (uint32_t desc_set = 0; desc_set < kMaxArgumentBuffers; desc_set++)
	{
		auto &resources = resources_in_set[desc_set];
		if (resources.empty())
			continue;

		assert(descriptor_set_is_argument_buffer(desc_set));

		uint32_t next_id = ir.increase_bound_by(3);
		uint32_t type_id = next_id + 1;
		uint32_t ptr_type_id = next_id + 2;
		argument_buffer_ids[desc_set] = next_id;

		auto &buffer_type = set<SPIRType>(type_id);

		buffer_type.basetype = SPIRType::Struct;

		if ((argument_buffer_device_storage_mask & (1u << desc_set)) != 0)
		{
			buffer_type.storage = StorageClassStorageBuffer;
			// Make sure the argument buffer gets marked as const device.
			set_decoration(next_id, DecorationNonWritable);
			// Need to mark the type as a Block to enable this.
			set_decoration(type_id, DecorationBlock);
		}
		else
			buffer_type.storage = StorageClassUniform;

		set_name(type_id, join("spvDescriptorSetBuffer", desc_set));

		auto &ptr_type = set<SPIRType>(ptr_type_id);
		ptr_type = buffer_type;
		ptr_type.pointer = true;
		ptr_type.pointer_depth = 1;
		ptr_type.parent_type = type_id;

		uint32_t buffer_variable_id = next_id;
		set<SPIRVariable>(buffer_variable_id, ptr_type_id, StorageClassUniform);
		set_name(buffer_variable_id, join("spvDescriptorSet", desc_set));

		// Ids must be emitted in ID order.
		sort(begin(resources), end(resources), [&](const Resource &lhs, const Resource &rhs) -> bool {
			return tie(lhs.index, lhs.basetype) < tie(rhs.index, rhs.basetype);
		});

		uint32_t member_index = 0;
		for (auto &resource : resources)
		{
			auto &var = *resource.var;
			auto &type = get_variable_data_type(var);
			string mbr_name = ensure_valid_name(resource.name, "m");
			if (resource.plane > 0)
				mbr_name += join(plane_name_suffix, resource.plane);
			set_member_name(buffer_type.self, member_index, mbr_name);

			if (resource.basetype == SPIRType::Sampler && type.basetype != SPIRType::Sampler)
			{
				// Have to synthesize a sampler type here.

				bool type_is_array = !type.array.empty();
				uint32_t sampler_type_id = ir.increase_bound_by(type_is_array ? 2 : 1);
				auto &new_sampler_type = set<SPIRType>(sampler_type_id);
				new_sampler_type.basetype = SPIRType::Sampler;
				new_sampler_type.storage = StorageClassUniformConstant;

				if (type_is_array)
				{
					uint32_t sampler_type_array_id = sampler_type_id + 1;
					auto &sampler_type_array = set<SPIRType>(sampler_type_array_id);
					sampler_type_array = new_sampler_type;
					sampler_type_array.array = type.array;
					sampler_type_array.array_size_literal = type.array_size_literal;
					sampler_type_array.parent_type = sampler_type_id;
					buffer_type.member_types.push_back(sampler_type_array_id);
				}
				else
					buffer_type.member_types.push_back(sampler_type_id);
			}
			else
			{
				uint32_t binding = get_decoration(var.self, DecorationBinding);
				SetBindingPair pair = { desc_set, binding };

				if (resource.basetype == SPIRType::Image || resource.basetype == SPIRType::Sampler ||
				    resource.basetype == SPIRType::SampledImage)
				{
					// Drop pointer information when we emit the resources into a struct.
					buffer_type.member_types.push_back(get_variable_data_type_id(var));
					if (resource.plane == 0)
						set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
				else if (buffers_requiring_dynamic_offset.count(pair))
				{
					// Don't set the qualified name here; we'll define a variable holding the corrected buffer address later.
					buffer_type.member_types.push_back(var.basetype);
					buffers_requiring_dynamic_offset[pair].second = var.self;
				}
				else if (inline_uniform_blocks.count(pair))
				{
					// Put the buffer block itself into the argument buffer.
					buffer_type.member_types.push_back(get_variable_data_type_id(var));
					set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
				else
				{
					// Resources will be declared as pointers not references, so automatically dereference as appropriate.
					buffer_type.member_types.push_back(var.basetype);
					if (type.array.empty())
						set_qualified_name(var.self, join("(*", to_name(buffer_variable_id), ".", mbr_name, ")"));
					else
						set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
			}

			set_extended_member_decoration(buffer_type.self, member_index, SPIRVCrossDecorationResourceIndexPrimary,
			                               resource.index);
			set_extended_member_decoration(buffer_type.self, member_index, SPIRVCrossDecorationInterfaceOrigID,
			                               var.self);
			member_index++;
		}
	}
}